

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O3

void __thiscall
Catch::BinaryExpr<bool,_int>::streamReconstructedExpression(BinaryExpr<bool,_int> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  undefined4 *puVar2;
  int in_EDX;
  string *in_R9;
  StringRef op;
  undefined4 *local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined1 auStack_4c [12];
  string local_40;
  
  if ((this->super_ITransientExpression).field_0xa == '\x01') {
    puVar2 = (undefined4 *)auStack_4c;
    local_50 = 0x65757274;
    local_58 = 4;
  }
  else {
    puVar2 = (undefined4 *)((long)auStack_4c + 1);
    auStack_4c[0] = 0x65;
    local_50 = 0x736c6166;
    local_58 = 5;
  }
  *(undefined1 *)puVar2 = 0;
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  local_60 = &local_50;
  StringMaker<int,void>::convert_abi_cxx11_
            (&local_40,(StringMaker<int,void> *)(ulong)(uint)this->m_rhs,in_EDX);
  op.m_size = (size_type)&local_40;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_60,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT44(auStack_4c._0_4_,local_50) + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }